

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

int __thiscall uWS::Group<false>::close(Group<false> *this,int __fd)

{
  uv_timer_t *puVar1;
  _func_void_uv_handle_t_ptr *p_Var2;
  Group<false> *in_RCX;
  Group<false> *in_stack_ffffffffffffffc0;
  
  forEach<uWS::Group<false>::close(int,char*,unsigned_long)::_lambda(uWS::WebSocket<false>)_1_>
            (in_RCX,(anon_class_24_3_b2829661 *)in_RCX);
  stopListening(in_stack_ffffffffffffffc0);
  if (this->timer != (uv_timer_t *)0x0) {
    uv_timer_stop(this->timer);
    puVar1 = this->timer;
    p_Var2 = uWS::Group::close(int,char*,unsigned_long)::{lambda(uv_handle_s*)#1}::
             operator_cast_to_function_pointer((_lambda_uv_handle_s___1_ *)&stack0xffffffffffffffc7)
    ;
    this = (Group<false> *)uv_close(puVar1,p_Var2);
  }
  return (int)this;
}

Assistant:

void Group<isServer>::close(int code, char *message, size_t length) {
    forEach([code, message, length](uWS::WebSocket<isServer> ws) {
        ws.close(code, message, length);
    });
    stopListening();
    if (timer) {
        uv_timer_stop(timer);
        uv_close((uv_handle_t *) timer, [](uv_handle_t *handle) {
            delete (uv_timer_t *) handle;
        });
    }
}